

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_utils.c
# Opt level: O2

void * ThreadLoop(void *ptr)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  bool bVar2;
  
  __mutex = *ptr;
  bVar2 = false;
  while (!bVar2) {
    pthread_mutex_lock(__mutex);
    while (iVar1 = *(int *)((long)ptr + 8), iVar1 == 1) {
      pthread_cond_wait((pthread_cond_t *)(__mutex + 1),__mutex);
    }
    if (iVar1 == 0) {
      bVar2 = true;
    }
    else {
      if (iVar1 == 2) {
        (*g_worker_interface.Execute)((WebPWorker *)ptr);
        *(undefined4 *)((long)ptr + 8) = 1;
      }
      bVar2 = false;
    }
    pthread_mutex_unlock(__mutex);
    pthread_cond_signal((pthread_cond_t *)(__mutex + 1));
  }
  return (void *)0x0;
}

Assistant:

static THREADFN ThreadLoop(void* ptr) {
  WebPWorker* const worker = (WebPWorker*)ptr;
  WebPWorkerImpl* const impl = (WebPWorkerImpl*)worker->impl_;
  int done = 0;
  while (!done) {
    pthread_mutex_lock(&impl->mutex_);
    while (worker->status_ == OK) {   // wait in idling mode
      pthread_cond_wait(&impl->condition_, &impl->mutex_);
    }
    if (worker->status_ == WORK) {
      WebPGetWorkerInterface()->Execute(worker);
      worker->status_ = OK;
    } else if (worker->status_ == NOT_OK) {   // finish the worker
      done = 1;
    }
    // signal to the main thread that we're done (for Sync())
    // Note the associated mutex does not need to be held when signaling the
    // condition. Unlocking the mutex first may improve performance in some
    // implementations, avoiding the case where the waiting thread can't
    // reacquire the mutex when woken.
    pthread_mutex_unlock(&impl->mutex_);
    pthread_cond_signal(&impl->condition_);
  }
  return THREAD_RETURN(NULL);    // Thread is finished
}